

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_req.cc
# Opt level: O0

int X509_REQ_check_private_key(X509_REQ *x509,EVP_PKEY *pkey)

{
  int iVar1;
  EVP_PKEY *a;
  int ret;
  EVP_PKEY *xk;
  EVP_PKEY *k_local;
  X509_REQ *x_local;
  
  a = (EVP_PKEY *)X509_REQ_get0_pubkey((X509_REQ *)x509);
  if (a == (EVP_PKEY *)0x0) {
    x_local._4_4_ = 0;
  }
  else {
    iVar1 = EVP_PKEY_cmp(a,pkey);
    if (iVar1 < 1) {
      if (iVar1 == -2) {
        iVar1 = EVP_PKEY_id(pkey);
        if (iVar1 == 0x198) {
          ERR_put_error(0xb,0,0xf,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_req.cc"
                        ,0x47);
        }
        else {
          ERR_put_error(0xb,0,0x80,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_req.cc"
                        ,0x49);
        }
        x_local._4_4_ = 0;
      }
      else if (iVar1 == -1) {
        ERR_put_error(0xb,0,0x73,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_req.cc"
                      ,0x43);
        x_local._4_4_ = 0;
      }
      else if (iVar1 == 0) {
        ERR_put_error(0xb,0,0x74,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_req.cc"
                      ,0x40);
        x_local._4_4_ = 0;
      }
      else {
        x_local._4_4_ = 0;
      }
    }
    else {
      x_local._4_4_ = 1;
    }
  }
  return x_local._4_4_;
}

Assistant:

int X509_REQ_check_private_key(const X509_REQ *x, const EVP_PKEY *k) {
  const EVP_PKEY *xk = X509_REQ_get0_pubkey(x);
  if (xk == NULL) {
    return 0;
  }

  int ret = EVP_PKEY_cmp(xk, k);
  if (ret > 0) {
    return 1;
  }

  switch (ret) {
    case 0:
      OPENSSL_PUT_ERROR(X509, X509_R_KEY_VALUES_MISMATCH);
      return 0;
    case -1:
      OPENSSL_PUT_ERROR(X509, X509_R_KEY_TYPE_MISMATCH);
      return 0;
    case -2:
      if (EVP_PKEY_id(k) == EVP_PKEY_EC) {
        OPENSSL_PUT_ERROR(X509, ERR_R_EC_LIB);
      } else {
        OPENSSL_PUT_ERROR(X509, X509_R_UNKNOWN_KEY_TYPE);
      }
      return 0;
  }

  return 0;
}